

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_row_access_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  undefined8 uVar1;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *pmVar2;
  bool bVar3;
  ID_index IVar4;
  reference pvVar5;
  lazy_ostream *plVar6;
  undefined4 local_578;
  uint local_574;
  basic_cstring<const_char> local_570;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_560;
  basic_cstring<const_char> local_538;
  basic_cstring<const_char> local_528;
  undefined1 local_518 [16];
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  *entry_2;
  pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
  *r_2;
  iterator __end0_2;
  iterator __begin0_2;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *__range1_2;
  basic_cstring<const_char> local_4d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4c8;
  assertion_result local_4a8;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  undefined4 local_46c;
  size_t local_468;
  basic_cstring<const_char> local_460;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_450;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  undefined4 local_404;
  size_t local_400;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3e8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  undefined4 local_3a0;
  uint local_39c;
  basic_cstring<const_char> local_398;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_388;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  undefined1 local_340 [16];
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  *entry_1;
  pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
  *r_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *__range1_1;
  basic_cstring<const_char> local_300;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2f0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  undefined4 local_294;
  size_t local_290;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_278;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  undefined4 local_22c;
  size_t local_228;
  basic_cstring<const_char> local_220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_210;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c8 [8];
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  moveCol;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_158;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  undefined1 local_110 [16];
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  *entry;
  pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
  *r;
  iterator __end0;
  iterator __begin0;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *__range1;
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_48;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_30;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *local_18;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *rows_local;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
  *matrix_local;
  
  local_18 = rows;
  rows_local = (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
                *)matrix;
  build_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            (&local_48,
             (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
              *)rows_local);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            (&local_30,&local_48);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_30);
  build_column_values<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&col.entryPool_,
             (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
              *)rows_local);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            (&local_70,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&col.entryPool_);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&col.entryPool_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_70);
  pvVar5 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           ::operator[]((vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                         *)rows_local,0);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&__range1,pvVar5,6,local_18,(Column_settings *)0x0);
  pmVar2 = local_18;
  __end0 = std::
           map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
           ::begin(local_18);
  r = (pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
       *)std::
         map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
         ::end(pmVar2);
  while (bVar3 = std::operator!=(&__end0,(_Self *)&r), bVar3) {
    entry = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
             *)std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
               ::operator*(&__end0);
    bVar3 = std::
            set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
            ::empty(&((reference)entry)->second);
    if (!bVar3) {
      std::
      set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
      ::rbegin((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *)local_110);
      local_110._8_8_ =
           std::
           reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                        *)local_110);
      IVar4 = Gudhi::persistence_matrix::
              Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                               *)local_110._8_8_);
      if (((IVar4 == 0) ||
          (IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_110._8_8_), IVar4 == 1)) ||
         ((IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_110._8_8_), IVar4 == 3 ||
          (IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_110._8_8_), IVar4 == 5)))) {
        do {
          uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_120,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
          boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x20d,&local_130);
          plVar6 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<(&local_158,plVar6,(char (*) [1])0x29b16e);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_168,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          moveCol.entryPool_._4_4_ =
               Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                         ((Entry_column_index<unsigned_int> *)local_110._8_8_);
          moveCol.entryPool_._0_4_ = 6;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&local_158,&local_168,0x20d,1,2,(undefined1 *)((long)&moveCol.entryPool_ + 4),
                     "entry.get_column_index()",&moveCol.entryPool_,"6");
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl(&local_158);
          bVar3 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar3);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
    ::operator++(&__end0);
  }
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::Set_column((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                *)local_1c8,
               (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                *)&__range1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d8,0x21c,&local_1e8);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_210,plVar6,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_228 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                ::size((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                        *)local_1c8);
    local_22c = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_210,&local_220,0x21c,1,2,&local_228,"moveCol.size()",&local_22c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_210);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_250);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_240,0x21d,&local_250);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_278,plVar6,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_290 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                ::size((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                        *)&__range1);
    local_294 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_278,&local_288,0x21d,1,2,&local_290,"col.size()",&local_294,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_278);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a8,0x21e,&local_2b8);
    pvVar5 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             ::operator[]((vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                           *)rows_local,0);
    bVar3 = Gudhi::persistence_matrix::operator==
                      (pvVar5,(Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                               *)local_1c8);
    boost::test_tools::assertion_result::assertion_result(&local_2d0,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,"matrix[0] == moveCol",0x14);
    boost::unit_test::operator<<(&local_2f0,plVar6,&local_300);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&__range1_1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2d0,&local_2f0,&__range1_1,0x21e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2f0);
    boost::test_tools::assertion_result::~assertion_result(&local_2d0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    pmVar2 = local_18;
  } while (bVar3);
  __end0_1 = std::
             map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
             ::begin(local_18);
  r_1 = (pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
         *)std::
           map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
           ::end(pmVar2);
  while (bVar3 = std::operator!=(&__end0_1,(_Self *)&r_1), bVar3) {
    entry_1 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
               *)std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
                 ::operator*(&__end0_1);
    bVar3 = std::
            set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
            ::empty(&((reference)entry_1)->second);
    if (!bVar3) {
      std::
      set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
      ::rbegin((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *)local_340);
      local_340._8_8_ =
           std::
           reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                        *)local_340);
      IVar4 = Gudhi::persistence_matrix::
              Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                               *)local_340._8_8_);
      if (((IVar4 == 0) ||
          (IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_340._8_8_), IVar4 == 1)) ||
         ((IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_340._8_8_), IVar4 == 3 ||
          (IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_340._8_8_), IVar4 == 5)))) {
        do {
          uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_350,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
          boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x225,&local_360);
          plVar6 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<(&local_388,plVar6,(char (*) [1])0x29b16e);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_398,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          local_39c = Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                                ((Entry_column_index<unsigned_int> *)local_340._8_8_);
          local_3a0 = 6;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&local_388,&local_398,0x225,1,2,&local_39c,"entry.get_column_index()",
                     &local_3a0,"6");
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl(&local_388);
          bVar3 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar3);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
    ::operator++(&__end0_1);
  }
  Gudhi::persistence_matrix::swap
            ((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              *)&__range1,
             (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              *)local_1c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x234,&local_3c0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3e8,plVar6,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_400 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                ::size((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                        *)local_1c8);
    local_404 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_3e8,&local_3f8,0x234,1,2,&local_400,"moveCol.size()",&local_404,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3e8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0x235,&local_428);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_450,plVar6,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_468 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                ::size((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                        *)&__range1);
    local_46c = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_450,&local_460,0x235,1,2,&local_468,"col.size()",&local_46c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_450);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_490);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x236,&local_490);
    pvVar5 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             ::operator[]((vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                           *)rows_local,0);
    bVar3 = Gudhi::persistence_matrix::operator==
                      (pvVar5,(Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                               *)&__range1);
    boost::test_tools::assertion_result::assertion_result(&local_4a8,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d8,"matrix[0] == col",0x10);
    boost::unit_test::operator<<(&local_4c8,plVar6,&local_4d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&__range1_2,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4a8,&local_4c8,&__range1_2,0x236,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4c8);
    boost::test_tools::assertion_result::~assertion_result(&local_4a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    pmVar2 = local_18;
  } while (bVar3);
  __end0_2 = std::
             map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
             ::begin(local_18);
  r_2 = (pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>
         *)std::
           map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
           ::end(pmVar2);
  while (bVar3 = std::operator!=(&__end0_2,(_Self *)&r_2), bVar3) {
    entry_2 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
               *)std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
                 ::operator*(&__end0_2);
    bVar3 = std::
            set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
            ::empty(&((reference)entry_2)->second);
    if (!bVar3) {
      std::
      set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
      ::rbegin((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *)local_518);
      local_518._8_8_ =
           std::
           reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                        *)local_518);
      IVar4 = Gudhi::persistence_matrix::
              Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                               *)local_518._8_8_);
      if ((((IVar4 == 0) ||
           (IVar4 = Gudhi::persistence_matrix::
                    Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                    ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                     *)local_518._8_8_), IVar4 == 1)) ||
          (IVar4 = Gudhi::persistence_matrix::
                   Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                    *)local_518._8_8_), IVar4 == 3)) ||
         (IVar4 = Gudhi::persistence_matrix::
                  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                  ::get_row_index((Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                                   *)local_518._8_8_), IVar4 == 5)) {
        do {
          uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_528,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_538);
          boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_528,0x23d,&local_538);
          plVar6 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<(&local_560,plVar6,(char (*) [1])0x29b16e);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_570,
                     "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
                     ,0x73);
          local_574 = Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                                ((Entry_column_index<unsigned_int> *)local_518._8_8_);
          local_578 = 6;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                    (&local_560,&local_570,0x23d,1,2,&local_574,"entry.get_column_index()",
                     &local_578,"6");
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl(&local_560);
          bVar3 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar3);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>
    ::operator++(&__end0_2);
  }
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                 *)local_1c8);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                 *)&__range1);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}